

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

void __thiscall
ylt::detail::moodycamel::
ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
::ProducerBase::ProducerBase
          (ProducerBase *this,
          ConcurrentQueue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>,_ylt::detail::moodycamel::ConcurrentQueueDefaultTraits>
          *parent_,bool isExplicit_)

{
  byte in_DL;
  undefined8 in_RSI;
  ConcurrentQueueProducerTypelessBase *in_RDI;
  __integral_type_conflict in_stack_ffffffffffffffd8;
  
  details::ConcurrentQueueProducerTypelessBase::ConcurrentQueueProducerTypelessBase(in_RDI);
  in_RDI->next = (ConcurrentQueueProducerTypelessBase *)&PTR__ProducerBase_003e37a0;
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,in_stack_ffffffffffffffd8);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,in_stack_ffffffffffffffd8);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,in_stack_ffffffffffffffd8);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[2].token = (ProducerToken *)0x0;
  *(byte *)&in_RDI[3].next = in_DL & 1;
  *(undefined8 *)&in_RDI[3].inactive = in_RSI;
  return;
}

Assistant:

ProducerBase(ConcurrentQueue* parent_, bool isExplicit_)
        : tailIndex(0),
          headIndex(0),
          dequeueOptimisticCount(0),
          dequeueOvercommit(0),
          tailBlock(nullptr),
          isExplicit(isExplicit_),
          parent(parent_) {}